

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  ushort **ppuVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int verbose;
  char *pcVar5;
  char *arg;
  int iVar6;
  long lVar7;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "rdjpgcom";
  }
  pcVar2 = progname;
  verbose = 0;
  lVar7 = 1;
  iVar6 = 0;
  do {
    if (argc <= lVar7) {
      infile = _stdin;
LAB_0010128e:
      scan_JPEG_header(verbose,iVar6);
      exit(0);
    }
    if (*argv[lVar7] != '-') {
      if ((int)lVar7 < argc + -1) {
        fprintf(_stderr,"%s: only one input file\n",pcVar2);
        usage();
      }
      infile = (FILE *)fopen(argv[lVar7],"rb");
      if ((FILE *)infile == (FILE *)0x0) {
        fprintf(_stderr,"%s: can\'t open %s\n",progname,argv[lVar7]);
        exit(1);
      }
      goto LAB_0010128e;
    }
    arg = argv[lVar7] + 1;
    iVar3 = keymatch(arg,"verbose",(int)in_RDX);
    if (iVar3 == 0) {
      pcVar5 = "raw";
      iVar3 = keymatch(arg,"raw",(int)extraout_RDX);
      iVar6 = 1;
      in_RDX = extraout_RDX_00;
      if (iVar3 == 0) {
        usage();
        lVar7 = 0;
        while( true ) {
          iVar6 = (int)arg[lVar7];
          if (arg[lVar7] == '\0') {
            return (uint)((int)lVar7 != 0);
          }
          cVar1 = pcVar5[lVar7];
          if (cVar1 == '\0') break;
          ppuVar4 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar4 + (long)iVar6 * 2 + 1) & 1) != 0) {
            iVar6 = tolower(iVar6);
          }
          if (iVar6 != cVar1) {
            return 0;
          }
          lVar7 = lVar7 + 1;
        }
        return 0;
      }
    }
    else {
      verbose = verbose + 1;
      in_RDX = extraout_RDX;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int verbose = 0, raw = 0;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "rdjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "verbose", 1)) {
      verbose++;
    } else if (keymatch(arg, "raw", 1)) {
      raw = 1;
    } else
      usage();
  }

  /* Open the input file. */
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Scan the JPEG headers. */
  (void)scan_JPEG_header(verbose, raw);

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}